

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  ExpressionSyntax *syntax_00;
  Type *lhs;
  size_t sVar1;
  Compilation *compilation;
  bool bVar2;
  int iVar3;
  Expression *pEVar4;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar5;
  SyntaxNode *this;
  SourceLocation location;
  Diagnostic *pDVar6;
  undefined4 extraout_var;
  ReplicatedAssignmentPatternExpression *expr;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar7;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  Info *extraout_RDX_01;
  size_t index;
  Type *pTVar8;
  byte bVar9;
  ulong uVar10;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> iVar11;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  size_t local_100;
  Compilation *local_f8;
  size_t local_f0;
  ASTContext *local_e8;
  Token local_e0;
  Expression *local_d0;
  Type *local_c8;
  size_t local_c0;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_b8;
  undefined1 local_b0 [64];
  undefined1 *local_70;
  Type *local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_100 = 0;
  syntax_00 = (syntax->countExpr).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  pEVar4 = bindReplCount(comp,syntax_00,context,&local_100);
  bVar2 = Expression::bad(pEVar4);
  if (bVar2) {
    pEVar4 = Expression::badExpr(comp,(Expression *)0x0);
    return pEVar4;
  }
  local_70 = local_58;
  local_68 = (Type *)0x0;
  local_60 = 5;
  local_f8 = comp;
  local_e8 = context;
  iVar11 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  sVar7 = iVar11.m_end.current;
  sVar5 = iVar11.m_begin.current;
  src.current = sVar7.current;
  if (sVar5.current != sVar7.current) {
    do {
      if ((sVar5.current)->kind != Field) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FieldSymbol]");
      }
      local_b0._0_8_ = DeclaredType::getType((DeclaredType *)(sVar5.current + 1));
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)&local_70,(Type **)local_b0);
      do {
        sVar5.current = (sVar5.current)->nextInScope;
        if (sVar5.current == (Symbol *)0x0) break;
      } while ((sVar5.current)->kind != Field);
      src.current = extraout_RDX;
    } while (sVar5.current != sVar7.current);
  }
  sVar1 = local_100;
  if (local_68 == (Type *)(((syntax->items).elements.size_ + 1 >> 1) * local_100)) {
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    local_c0 = local_100;
    local_d0 = pEVar4;
    local_c8 = type;
    if (local_100 == 0) {
      bVar9 = 0;
    }
    else {
      local_b8 = &syntax->items;
      bVar9 = 0;
      local_f0 = 0;
      pTVar8 = (Type *)0x0;
      do {
        uVar10 = (syntax->items).elements.size_ + 1;
        if (1 < uVar10) {
          index = 0;
          do {
            this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                              (local_b8,index)->super_SyntaxNode;
            if (local_68 <= pTVar8) {
              assert::assertFailed
                        ("index < len",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                         ,0x196,
                         "reference slang::SmallVectorBase<const slang::ast::Type *>::operator[](size_type) [T = const slang::ast::Type *]"
                        );
            }
            lhs = *(Type **)(local_70 + (long)pTVar8 * 8);
            local_e0 = slang::syntax::SyntaxNode::getFirstToken(this);
            location = parsing::Token::location(&local_e0);
            pEVar4 = Expression::bindRValue
                               (lhs,(ExpressionSyntax *)this,location,local_e8,
                                (bitmask<slang::ast::ASTFlags>)0x0);
            local_e0._0_8_ = pEVar4;
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                       (Expression **)&local_e0);
            bVar2 = Expression::bad(pEVar4);
            bVar9 = bVar9 | bVar2;
            index = index + 1;
            pTVar8 = (Type *)((long)&(pTVar8->super_Symbol).kind + 1);
            src.current = extraout_RDX_00;
          } while (uVar10 >> 1 != index);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != local_c0);
    }
    compilation = local_f8;
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)local_f8,(EVP_PKEY_CTX *)src.current);
    local_e0.rawLen = extraout_var;
    local_e0.kind = (short)iVar3;
    local_e0._2_1_ = (char)((uint)iVar3 >> 0x10);
    local_e0.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    local_e0.info = extraout_RDX_01;
    expr = BumpAllocator::
           emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,local_c8,local_d0,
                      (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&local_e0,
                      &sourceRange);
    if (bVar9 != 0) {
      expr = (ReplicatedAssignmentPatternExpression *)
             Expression::badExpr(compilation,(Expression *)expr);
    }
    if ((Type *)local_b0._0_8_ != (Type *)(local_b0 + 0x18)) {
      free((void *)local_b0._0_8_);
    }
  }
  else {
    pDVar6 = ASTContext::addDiag(local_e8,(DiagCode)0x970007,sourceRange);
    pDVar6 = ast::operator<<(pDVar6,type);
    local_b0._0_8_ = local_68;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)local_b0);
    local_b0._0_8_ = ((syntax->items).elements.size_ + 1 >> 1) * sVar1;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)local_b0);
    expr = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(local_f8,(Expression *)0x0);
  }
  if (local_70 != local_58) {
    free(local_70);
  }
  return (Expression *)expr;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (size_t i = 0; i < count; i++) {
        for (auto item : syntax.items) {
            auto& expr = Expression::bindRValue(*types[index++], *item,
                                                item->getFirstToken().location(), context);
            elems.push_back(&expr);
            bad |= expr.bad();
        }
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}